

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

SESSION_SEND_TRANSFER_RESULT
session_send_transfer
          (LINK_ENDPOINT_HANDLE link_endpoint,TRANSFER_HANDLE transfer,PAYLOAD *payloads,
          size_t payload_count,delivery_number *delivery_id,ON_SEND_COMPLETE on_send_complete,
          void *callback_context)

{
  SESSION_HANDLE pSVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  AMQP_VALUE value;
  PAYLOAD *pPVar5;
  size_t *psVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  SESSION_SEND_TRANSFER_RESULT SVar10;
  uint uVar11;
  ulong uVar12;
  ON_SEND_COMPLETE on_send_complete_00;
  uint uVar13;
  bool bVar14;
  uint local_7c;
  AMQP_VALUE local_78;
  uint local_6c;
  ulong local_68;
  AMQP_VALUE local_60;
  ulong local_58;
  PAYLOAD *local_50;
  ON_SEND_COMPLETE local_48;
  ulong local_40;
  size_t encoded_size;
  
  if ((transfer == (TRANSFER_HANDLE)0x0 || link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) ||
     (pSVar1 = link_endpoint->session, pSVar1->session_state != SESSION_STATE_MAPPED)) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  psVar6 = &payloads->length;
  sVar9 = 0xffffffffffffffff;
  uVar4 = 0;
  while (sVar9 = sVar9 + 1, payload_count != sVar9) {
    uVar8 = *psVar6;
    if (uVar8 >> 0x20 != 0) {
      return SESSION_SEND_TRANSFER_ERROR;
    }
    psVar6 = psVar6 + 2;
    bVar14 = CARRY8(uVar4,uVar8);
    uVar4 = uVar4 + uVar8;
    if (bVar14) {
      return SESSION_SEND_TRANSFER_ERROR;
    }
  }
  if (uVar4 >> 0x20 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  if (pSVar1->remote_incoming_window == 0) {
    return SESSION_SEND_TRANSFER_BUSY;
  }
  *delivery_id = pSVar1->next_outgoing_id;
  local_48 = on_send_complete;
  iVar3 = transfer_set_handle(transfer,link_endpoint->output_handle);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = transfer_set_delivery_id(transfer,*delivery_id);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = transfer_set_more(transfer,false);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  value = amqpvalue_create_transfer(transfer);
  if (value == (AMQP_VALUE)0x0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = connection_get_remote_max_frame_size(pSVar1->connection,&local_7c);
  SVar10 = SESSION_SEND_TRANSFER_ERROR;
  if ((iVar3 == 0) && (iVar3 = amqpvalue_get_encoded_size(value,&encoded_size), iVar3 == 0)) {
    psVar6 = &payloads->length;
    uVar4 = 0;
    sVar9 = payload_count;
    while (bVar14 = sVar9 != 0, sVar9 = sVar9 - 1, bVar14) {
      uVar4 = uVar4 + *psVar6;
      psVar6 = psVar6 + 2;
    }
    local_7c = (local_7c - (int)encoded_size) - 8;
    if (local_7c < uVar4) {
      uVar13 = 0;
      local_58 = 0;
      local_78 = value;
      for (; uVar4 != 0; uVar4 = uVar4 - local_6c) {
        local_68 = (ulong)local_7c;
        uVar8 = uVar4 & 0xffffffff;
        if (local_7c < (uint)uVar4) {
          uVar8 = (ulong)local_7c;
        }
        local_40 = uVar4;
        iVar3 = transfer_set_more(transfer,local_68 < uVar4);
        value = local_78;
        if (iVar3 != 0) goto LAB_001581a9;
        local_60 = amqpvalue_create_transfer(transfer);
        uVar11 = (uint)uVar8;
        uVar4 = local_58;
        value = local_78;
        uVar7 = uVar13;
        if (local_60 == (AMQP_VALUE)0x0) goto LAB_001581a9;
LAB_00158003:
        pPVar5 = payloads + uVar4;
        while ((int)uVar8 != 0) {
          uVar12 = (ulong)uVar7;
          uVar7 = uVar7 + (int)uVar8;
          bVar14 = pPVar5->length - uVar12 < uVar8;
          uVar8 = 0;
          if (bVar14) goto code_r0x0015802d;
        }
        uVar8 = (uVar4 - local_58) + 1;
        if (uVar8 == 0) {
          uVar8 = 0xffffffffffffffff;
        }
        uVar12 = 0xffffffff;
        if (uVar8 < 0xffffffff) {
          uVar12 = uVar8;
        }
        local_6c = uVar11;
        if (((uVar4 < local_58) || (0xfffffffe < uVar8)) ||
           (pPVar5 = (PAYLOAD *)calloc(1,uVar12 << 4), uVar4 = local_40, pPVar5 == (PAYLOAD *)0x0))
        {
          amqpvalue_destroy(local_60);
          value = local_78;
          goto LAB_001581a9;
        }
        psVar6 = &pPVar5->length;
        uVar7 = local_6c;
        for (sVar9 = 0; (uVar7 != 0 && (sVar9 < uVar12)); sVar9 = sVar9 + 1) {
          sVar2 = payloads[local_58].length;
          uVar8 = sVar2 - uVar13;
          ((PAYLOAD *)(psVar6 + -1))->bytes = payloads[local_58].bytes + uVar13;
          if (uVar7 < uVar8) {
            *psVar6 = (ulong)uVar7;
            uVar13 = uVar13 + uVar7;
            uVar7 = 0;
          }
          else {
            *psVar6 = uVar8;
            uVar7 = (uVar7 + uVar13) - (int)sVar2;
            local_58 = local_58 + 1;
            uVar13 = 0;
          }
          psVar6 = psVar6 + 2;
        }
        on_send_complete_00 = local_48;
        if (local_68 < local_40) {
          on_send_complete_00 = (ON_SEND_COMPLETE)0x0;
        }
        local_50 = pPVar5;
        iVar3 = connection_encode_frame
                          (pSVar1->endpoint,local_60,pPVar5,sVar9,on_send_complete_00,
                           callback_context);
        local_68 = CONCAT44(local_68._4_4_,iVar3);
        free(local_50);
        amqpvalue_destroy(local_60);
        value = local_78;
        if ((int)local_68 != 0) goto LAB_001581a9;
      }
      pSVar1->next_outgoing_id = pSVar1->next_outgoing_id + 1;
      pSVar1->remote_incoming_window = pSVar1->remote_incoming_window - 1;
      pSVar1->outgoing_window = pSVar1->outgoing_window - 1;
      SVar10 = SESSION_SEND_TRANSFER_OK;
      value = local_78;
    }
    else {
      iVar3 = connection_encode_frame
                        (pSVar1->endpoint,value,payloads,payload_count,local_48,callback_context);
      if (iVar3 == 0) {
        pSVar1->next_outgoing_id = pSVar1->next_outgoing_id + 1;
        pSVar1->remote_incoming_window = pSVar1->remote_incoming_window - 1;
        pSVar1->outgoing_window = pSVar1->outgoing_window - 1;
        SVar10 = SESSION_SEND_TRANSFER_OK;
      }
    }
  }
LAB_001581a9:
  amqpvalue_destroy(value);
  return SVar10;
code_r0x0015802d:
  uVar4 = uVar4 + 1;
  uVar8 = (ulong)(uVar7 - (int)pPVar5->length);
  uVar7 = 0;
  goto LAB_00158003;
}

Assistant:

SESSION_SEND_TRANSFER_RESULT session_send_transfer(LINK_ENDPOINT_HANDLE link_endpoint, TRANSFER_HANDLE transfer, PAYLOAD* payloads, size_t payload_count, delivery_number* delivery_id, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    SESSION_SEND_TRANSFER_RESULT result;

    /* Codes_S_R_S_SESSION_01_054: [If link_endpoint or transfer is NULL, session_send_transfer shall fail and return a non-zero value.] */
    if ((link_endpoint == NULL) ||
        (transfer == NULL))
    {
        result = SESSION_SEND_TRANSFER_ERROR;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        /* Codes_S_R_S_SESSION_01_059: [When session_send_transfer is called while the session is not in the MAPPED state, session_send_transfer shall fail and return a non-zero value.] */
        if (session_instance->session_state != SESSION_STATE_MAPPED)
        {
            result = SESSION_SEND_TRANSFER_ERROR;
        }
        else
        {
            size_t payload_size = 0;
            size_t i;

            for (i = 0; i < payload_count; i++)
            {
                if ((payloads[i].length > UINT32_MAX) ||
                    (payload_size + payloads[i].length < payload_size))
                {
                    break;
                }

                payload_size += payloads[i].length;
            }

            if ((i < payload_count) ||
                (payload_size > UINT32_MAX))
            {
                result = SESSION_SEND_TRANSFER_ERROR;
            }
            else
            {
                if (session_instance->remote_incoming_window == 0)
                {
                    result = SESSION_SEND_TRANSFER_BUSY;
                }
                else
                {
                    /* Codes_S_R_S_SESSION_01_012: [The session endpoint assigns each outgoing transfer frame an implicit transfer-id from a session scoped sequence.] */
                    /* Codes_S_R_S_SESSION_01_027: [sending a transfer Upon sending a transfer, the sending endpoint will increment its next-outgoing-id] */
                    *delivery_id = session_instance->next_outgoing_id;
                    if ((transfer_set_handle(transfer, link_endpoint_instance->output_handle) != 0) ||
                        (transfer_set_delivery_id(transfer, *delivery_id) != 0) ||
                        (transfer_set_more(transfer, false) != 0))
                    {
                        /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                        result = SESSION_SEND_TRANSFER_ERROR;
                    }
                    else
                    {
                        AMQP_VALUE transfer_value;

                        transfer_value = amqpvalue_create_transfer(transfer);
                        if (transfer_value == NULL)
                        {
                            /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                            result = SESSION_SEND_TRANSFER_ERROR;
                        }
                        else
                        {
                            uint32_t available_frame_size;
                            size_t encoded_size;

                            if ((connection_get_remote_max_frame_size(session_instance->connection, &available_frame_size) != 0) ||
                                (amqpvalue_get_encoded_size(transfer_value, &encoded_size) != 0))
                            {
                                result = SESSION_SEND_TRANSFER_ERROR;
                            }
                            else
                            {
                                payload_size = 0;

                                for (i = 0; i < payload_count; i++)
                                {
                                    payload_size += payloads[i].length;
                                }

                                available_frame_size -= (uint32_t)encoded_size;
                                available_frame_size -= 8;

                                if (available_frame_size >= payload_size)
                                {
                                    /* Codes_S_R_S_SESSION_01_055: [The encoding of the frame shall be done by calling connection_encode_frame and passing as arguments: the connection handle associated with the session, the transfer performative and the payload chunks passed to session_send_transfer.] */
                                    if (connection_encode_frame(session_instance->endpoint, transfer_value, payloads, payload_count, on_send_complete, callback_context) != 0)
                                    {
                                        /* Codes_S_R_S_SESSION_01_056: [If connection_encode_frame fails then session_send_transfer shall fail and return a non-zero value.] */
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        /* Codes_S_R_S_SESSION_01_053: [On success, session_send_transfer shall return 0.] */
                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                                else
                                {
                                    size_t current_payload_index = 0;
                                    uint32_t current_payload_pos = 0;

                                    /* break it down into different deliveries */
                                    while (payload_size > 0)
                                    {
                                        uint32_t transfer_frame_payload_count = 0;
                                        uint32_t current_transfer_frame_payload_size = (uint32_t)payload_size;
                                        uint32_t byte_counter;
                                        size_t temp_current_payload_index = current_payload_index;
                                        uint32_t temp_current_payload_pos = current_payload_pos;
                                        AMQP_VALUE multi_transfer_amqp_value;
                                        PAYLOAD* transfer_frame_payloads;
                                        bool more;

                                        if (current_transfer_frame_payload_size > available_frame_size)
                                        {
                                            current_transfer_frame_payload_size = available_frame_size;
                                        }

                                        if (available_frame_size >= payload_size)
                                        {
                                            more = false;
                                        }
                                        else
                                        {
                                            more = true;
                                        }

                                        if (transfer_set_more(transfer, more) != 0)
                                        {
                                            break;
                                        }

                                        multi_transfer_amqp_value = amqpvalue_create_transfer(transfer);
                                        if (multi_transfer_amqp_value == NULL)
                                        {
                                            break;
                                        }

                                        byte_counter = current_transfer_frame_payload_size;
                                        while (byte_counter > 0)
                                        {
                                            if (payloads[temp_current_payload_index].length - temp_current_payload_pos >= byte_counter)
                                            {
                                                /* more data than we need */
                                                temp_current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                byte_counter -= (uint32_t)payloads[temp_current_payload_index].length - temp_current_payload_pos;
                                                temp_current_payload_index++;
                                                temp_current_payload_pos = 0;
                                            }
                                        }

                                        //transfer_frame_payload_len = (uint32_t)(temp_current_payload_index - current_payload_index + 1); // use safe int
                                        size_t payload_len = safe_subtract_size_t(temp_current_payload_index, current_payload_index);
                                        payload_len = safe_add_size_t(payload_len, 1);
                                        uint32_t transfer_frame_payload_len = payload_len < UINT32_MAX ? (uint32_t)payload_len : UINT32_MAX;

                                        if (transfer_frame_payload_len == UINT32_MAX ||
                                           (transfer_frame_payloads = (PAYLOAD*)calloc(1, (transfer_frame_payload_len * sizeof(PAYLOAD)))) == NULL)
                                        {
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        /* copy data */
                                        byte_counter = current_transfer_frame_payload_size;
                                        transfer_frame_payload_count = 0;

                                        while (byte_counter > 0 && transfer_frame_payload_count < transfer_frame_payload_len)
                                        {
                                            if (payloads[current_payload_index].length - current_payload_pos > byte_counter)
                                            {
                                                /* more data than we need */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = byte_counter;
                                                current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                /* copy entire payload and move to the next */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = payloads[current_payload_index].length - current_payload_pos;
                                                byte_counter -= (uint32_t)payloads[current_payload_index].length - current_payload_pos;
                                                current_payload_index++;
                                                current_payload_pos = 0;
                                            }

                                            transfer_frame_payload_count++;
                                        }

                                        if (connection_encode_frame(session_instance->endpoint, multi_transfer_amqp_value, transfer_frame_payloads, transfer_frame_payload_count,
                                            /* only fire the send complete calllback on the last frame of the multi frame transfer */
                                            more ? NULL : on_send_complete,
                                            callback_context) != 0)
                                        {
                                            free(transfer_frame_payloads);
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        free(transfer_frame_payloads);
                                        amqpvalue_destroy(multi_transfer_amqp_value);
                                        payload_size -= current_transfer_frame_payload_size;
                                    }

                                    if (payload_size > 0)
                                    {
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                            }

                            amqpvalue_destroy(transfer_value);
                        }
                    }
                }
            }
        }
    }

    return result;
}